

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionTicketThreads_Test::TestBody
          (SSLVersionTest_SessionTicketThreads_Test *this)

{
  bool bVar1;
  pointer psVar2;
  pointer psVar3;
  char *pcVar4;
  char *in_R9;
  thread *thread;
  iterator __end3;
  iterator __begin3;
  vector<std::thread,_std::allocator<std::thread>_> *__range3;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> *local_230;
  type local_228;
  type local_218;
  type local_208;
  type local_1f8;
  type local_1f0;
  undefined1 local_1e8 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_8_1_8991fb9c connect_with_session;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__1;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_130;
  UniquePtr<SSL_SESSION> session2;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_90;
  UniquePtr<SSL_SESSION> session1;
  Message local_80;
  uint local_74;
  undefined1 local_70 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ScopedTrace local_42;
  bool local_41;
  ScopedTrace gtest_trace_6663;
  const_iterator pbStack_40;
  bool renew_ticket;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_28;
  initializer_list<bool> *local_18;
  initializer_list<bool> *__range2;
  SSLVersionTest_SessionTicketThreads_Test *this_local;
  
  __begin2._6_1_ = 0;
  __begin2._7_1_ = 1;
  local_28._M_array = (iterator)((long)&__begin2 + 6);
  local_28._M_len = 2;
  local_18 = &local_28;
  __range2 = (initializer_list<bool> *)this;
  __end2 = std::initializer_list<bool>::begin(local_18);
  pbStack_40 = std::initializer_list<bool>::end(local_18);
  do {
    if (__end2 == pbStack_40) {
      return;
    }
    local_41 = (bool)(*__end2 & 1);
    testing::ScopedTrace::ScopedTrace<bool>
              (&local_42,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a07,&local_41);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_70);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                        ((HasNewFatalFailureHelper *)local_70);
      if (bVar1) {
        local_74 = 4;
      }
      else {
        local_74 = 0;
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_70);
      if (local_74 == 0) {
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_ctx_);
        SSL_CTX_set_session_cache_mode(psVar2,3);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        SSL_CTX_set_session_cache_mode(psVar2,3);
        if ((local_41 & 1U) != 0) {
          psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_ctx_);
          SSL_CTX_set_tlsext_ticket_key_cb(psVar2,RenewTicketCallback);
        }
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_ctx_);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_ctx_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        ClientConfig::ClientConfig((ClientConfig *)&gtest_ar_.message_);
        CreateClientSession((anon_unknown_0 *)&local_90,psVar2,psVar3,
                            (ClientConfig *)&gtest_ar_.message_);
        ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar_.message_);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_f8,&local_90,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_100);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&session2,(internal *)local_f8,(AssertionResult *)0x4e0925,"false",
                     "true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1a12,pcVar4);
          testing::internal::AssertHelper::operator=(&local_108,&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          std::__cxx11::string::~string((string *)&session2);
          testing::Message::~Message(&local_100);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        if (local_74 == 0) {
          psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).client_ctx_);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_ctx_);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__1.message_);
          CreateClientSession((anon_unknown_0 *)&local_130,psVar2,psVar3,
                              (ClientConfig *)&gtest_ar__1.message_);
          ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__1.message_);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_198,&local_130,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
          if (!bVar1) {
            testing::Message::Message(&local_1a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&connect_with_session,(internal *)local_198,
                       (AssertionResult *)0x4e0936,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1a15,pcVar4);
            testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            std::__cxx11::string::~string((string *)&connect_with_session);
            testing::Message::~Message(&local_1a0);
          }
          local_74 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
          if (local_74 == 0) {
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this;
            std::vector<std::thread,_std::allocator<std::thread>_>::vector
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_1e8);
            local_1f0.connect_with_session =
                 (anon_class_8_1_8991fb9c *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__0>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,&local_1f0);
            local_1f8.connect_with_session =
                 (anon_class_8_1_8991fb9c *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__1>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,&local_1f8);
            local_208.connect_with_session =
                 (anon_class_8_1_8991fb9c *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            local_208.session1 = &local_90;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__2>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,&local_208);
            local_218.connect_with_session =
                 (anon_class_8_1_8991fb9c *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            local_218.session1 = &local_90;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__3>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,&local_218);
            local_228.connect_with_session =
                 (anon_class_8_1_8991fb9c *)
                 &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
            local_228.session2 = &local_130;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__4>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,&local_228);
            __range3 = (vector<std::thread,_std::allocator<std::thread>_> *)
                       &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_230 = &local_130;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<bssl::(anonymous_namespace)::SSLVersionTest_SessionTicketThreads_Test::TestBody()::__5>
                      ((vector<std::thread,std::allocator<std::thread>> *)local_1e8,
                       (type *)&__range3);
            __end3 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                               ((vector<std::thread,_std::allocator<std::thread>_> *)local_1e8);
            thread = (thread *)
                     std::vector<std::thread,_std::allocator<std::thread>_>::end
                               ((vector<std::thread,_std::allocator<std::thread>_> *)local_1e8);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                               *)&thread), bVar1) {
              __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator*(&__end3);
              std::thread::join();
              __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator++(&__end3);
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_1e8);
            local_74 = 0;
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_130);
        }
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_90);
      }
      else if (local_74 == 4) goto LAB_0020db41;
    }
    else {
LAB_0020db41:
      testing::Message::Message(&local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&session1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a08,
                 "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&session1,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&session1);
      testing::Message::~Message(&local_80);
      local_74 = 1;
    }
    testing::ScopedTrace::~ScopedTrace(&local_42);
    if (local_74 != 0) {
      return;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

TEST_P(SSLVersionTest, SessionTicketThreads) {
  for (bool renew_ticket : {false, true}) {
    SCOPED_TRACE(renew_ticket);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());
    SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
    SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
    if (renew_ticket) {
      SSL_CTX_set_tlsext_ticket_key_cb(server_ctx_.get(), RenewTicketCallback);
    }

    // Establish two client sessions to test with.
    bssl::UniquePtr<SSL_SESSION> session1 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session1);
    bssl::UniquePtr<SSL_SESSION> session2 =
        CreateClientSession(client_ctx_.get(), server_ctx_.get());
    ASSERT_TRUE(session2);

    auto connect_with_session = [&](SSL_SESSION *session) {
      ClientConfig config;
      config.session = session;
      UniquePtr<SSL> client, server;
      ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                         server_ctx_.get(), config));
    };

    // Resume sessions in parallel with establishing new ones.
    {
      std::vector<std::thread> threads;
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(nullptr); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session1.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      threads.emplace_back([&] { connect_with_session(session2.get()); });
      for (auto &thread : threads) {
        thread.join();
      }
    }
  }
}